

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O3

void __thiscall dlib::rand::set_seed(rand *this,string *value)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int block;
  size_type sVar6;
  
  std::__cxx11::string::_M_assign((string *)&this->seed);
  if (value->_M_string_length == 0) {
    iVar3 = 1;
    (this->mt).x[0] = 0x1571;
    (this->mt).i = 1;
    do {
      uVar4 = (this->mt).x[(long)iVar3 + -1];
      (this->mt).x[iVar3] = (uVar4 >> 0x1e ^ uVar4) * 0x6c078965 + iVar3;
      iVar5 = (this->mt).i;
      iVar3 = iVar5 + 1;
      (this->mt).i = iVar3;
    } while (iVar5 < 0x26f);
  }
  else {
    sVar2 = (this->seed)._M_string_length;
    if (sVar2 == 0) {
      uVar4 = 0;
    }
    else {
      sVar6 = 0;
      uVar4 = 0;
      do {
        pcVar1 = (this->seed)._M_dataplus._M_p + sVar6;
        sVar6 = sVar6 + 1;
        uVar4 = (int)*pcVar1 + uVar4 * 0x25;
      } while (sVar2 != sVar6);
    }
    iVar3 = 1;
    (this->mt).x[0] = uVar4;
    (this->mt).i = 1;
    do {
      uVar4 = (this->mt).x[(long)iVar3 + -1];
      (this->mt).x[iVar3] = (uVar4 >> 0x1e ^ uVar4) * 0x6c078965 + iVar3;
      iVar5 = (this->mt).i;
      iVar3 = iVar5 + 1;
      (this->mt).i = iVar3;
    } while (iVar5 < 0x26f);
  }
  iVar5 = 10000;
  do {
    block = 0;
    if ((iVar3 == 0x270) || (block = 1, 0x4df < iVar3)) {
      random_helpers::
      mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
      ::twist(&this->mt,block);
      iVar3 = (this->mt).i;
    }
    iVar3 = iVar3 + 1;
    iVar5 = iVar5 + -1;
    (this->mt).i = iVar3;
  } while (iVar5 != 0);
  this->has_gaussian = false;
  this->next_gaussian = 0.0;
  return;
}

Assistant:

void set_seed (
                const std::string& value
            )
            {
                seed = value;

                // make sure we do the seeding so that using a seed of "" gives the same
                // state as calling this->clear()
                if (value.size() != 0)
                {
                    uint32 s = 0;
                    for (std::string::size_type i = 0; i < seed.size(); ++i)
                    {
                        s = (s*37) + static_cast<uint32>(seed[i]);
                    }
                    mt.seed(s);
                }
                else
                {
                    mt.seed();
                }

                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();


                has_gaussian = false;
                next_gaussian = 0;
            }